

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkPrintNodeArray(Wlc_Ntk_t *p,Vec_Int_t *vArray)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  undefined4 local_24;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vArray_local;
  Wlc_Ntk_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vArray), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vArray,local_24);
    pObj_00 = Wlc_NtkObj(p,iVar1);
    Wlc_NtkPrintNode(p,pObj_00);
  }
  return;
}

Assistant:

void Wlc_NtkPrintNodeArray( Wlc_Ntk_t * p, Vec_Int_t * vArray )
{
    Wlc_Obj_t * pObj; 
    int i;
    Wlc_NtkForEachObjVec( vArray, p, pObj, i )
        Wlc_NtkPrintNode( p, pObj );
}